

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

void __thiscall rsg::TexLookup::tokenize(TexLookup *this,GeneratorState *state,TokenStream *str)

{
  Type TVar1;
  char *pcVar2;
  Token local_30;
  
  TVar1 = state->m_shader->m_type;
  if (state->m_programParams->version == VERSION_300) {
    switch(this->m_type) {
    case TYPE_TEXTURE2D:
      Token::Token(&local_30,"texture");
      TokenStream::operator<<(str,&local_30);
      break;
    case TYPE_TEXTURE2D_LOD:
      pcVar2 = "texture";
      if (TVar1 == TYPE_VERTEX) {
        pcVar2 = "textureLod";
      }
      Token::Token(&local_30,pcVar2);
      TokenStream::operator<<(str,&local_30);
      break;
    case TYPE_TEXTURE2D_PROJ:
      Token::Token(&local_30,"textureProj");
      TokenStream::operator<<(str,&local_30);
      break;
    case TYPE_TEXTURE2D_PROJ_LOD:
      pcVar2 = "textureProj";
      if (TVar1 == TYPE_VERTEX) {
        pcVar2 = "textureProjLod";
      }
      Token::Token(&local_30,pcVar2);
      TokenStream::operator<<(str,&local_30);
      break;
    case TYPE_TEXTURECUBE:
      Token::Token(&local_30,"texture");
      TokenStream::operator<<(str,&local_30);
      break;
    case TYPE_TEXTURECUBE_LOD:
      pcVar2 = "texture";
      if (TVar1 == TYPE_VERTEX) {
        pcVar2 = "textureLod";
      }
      Token::Token(&local_30,pcVar2);
      TokenStream::operator<<(str,&local_30);
      break;
    default:
      goto switchD_005439e7_default;
    }
  }
  else {
    switch(this->m_type) {
    case TYPE_TEXTURE2D:
      Token::Token(&local_30,"texture2D");
      TokenStream::operator<<(str,&local_30);
      break;
    case TYPE_TEXTURE2D_LOD:
      pcVar2 = "texture2D";
      if (TVar1 == TYPE_VERTEX) {
        pcVar2 = "texture2DLod";
      }
      Token::Token(&local_30,pcVar2);
      TokenStream::operator<<(str,&local_30);
      break;
    case TYPE_TEXTURE2D_PROJ:
      Token::Token(&local_30,"texture2DProj");
      TokenStream::operator<<(str,&local_30);
      break;
    case TYPE_TEXTURE2D_PROJ_LOD:
      pcVar2 = "texture2DProj";
      if (TVar1 == TYPE_VERTEX) {
        pcVar2 = "texture2DProjLod";
      }
      Token::Token(&local_30,pcVar2);
      TokenStream::operator<<(str,&local_30);
      break;
    case TYPE_TEXTURECUBE:
      Token::Token(&local_30,"textureCube");
      TokenStream::operator<<(str,&local_30);
      break;
    case TYPE_TEXTURECUBE_LOD:
      pcVar2 = "textureCube";
      if (TVar1 == TYPE_VERTEX) {
        pcVar2 = "textureCubeLod";
      }
      Token::Token(&local_30,pcVar2);
      TokenStream::operator<<(str,&local_30);
      break;
    default:
      goto switchD_005439e7_default;
    }
  }
  Token::~Token(&local_30);
switchD_005439e7_default:
  local_30.m_type = LEFT_PAREN;
  TokenStream::operator<<(str,&local_30);
  Token::~Token(&local_30);
  Token::Token(&local_30,(this->m_sampler->m_name)._M_dataplus._M_p);
  TokenStream::operator<<(str,&local_30);
  Token::~Token(&local_30);
  local_30.m_type = COMMA;
  TokenStream::operator<<(str,&local_30);
  Token::~Token(&local_30);
  (*this->m_coordExpr->_vptr_Expression[3])(this->m_coordExpr,state,str);
  if (this->m_lodBiasExpr != (Expression *)0x0) {
    local_30.m_type = COMMA;
    TokenStream::operator<<(str,&local_30);
    Token::~Token(&local_30);
    (*this->m_lodBiasExpr->_vptr_Expression[3])(this->m_lodBiasExpr,state,str);
  }
  local_30.m_type = RIGHT_PAREN;
  TokenStream::operator<<(str,&local_30);
  Token::~Token(&local_30);
  return;
}

Assistant:

void TexLookup::tokenize (GeneratorState& state, TokenStream& str) const
{
	bool isVertex = state.getShader().getType() == Shader::TYPE_VERTEX;

	if (state.getProgramParameters().version == VERSION_300)
	{
		switch (m_type)
		{
			case TYPE_TEXTURE2D:			str << "texture";										break;
			case TYPE_TEXTURE2D_LOD:		str << (isVertex ? "textureLod" : "texture");			break;
			case TYPE_TEXTURE2D_PROJ:		str << "textureProj";									break;
			case TYPE_TEXTURE2D_PROJ_LOD:	str << (isVertex ? "textureProjLod" : "textureProj");	break;
			case TYPE_TEXTURECUBE:			str << "texture";										break;
			case TYPE_TEXTURECUBE_LOD:		str << (isVertex ? "textureLod" : "texture");			break;
			default:
				DE_ASSERT(DE_FALSE);
		}
	}
	else
	{
		switch (m_type)
		{
			case TYPE_TEXTURE2D:			str << "texture2D";											break;
			case TYPE_TEXTURE2D_LOD:		str << (isVertex ? "texture2DLod" : "texture2D");			break;
			case TYPE_TEXTURE2D_PROJ:		str << "texture2DProj";										break;
			case TYPE_TEXTURE2D_PROJ_LOD:	str << (isVertex ? "texture2DProjLod" : "texture2DProj");	break;
			case TYPE_TEXTURECUBE:			str << "textureCube";										break;
			case TYPE_TEXTURECUBE_LOD:		str << (isVertex ? "textureCubeLod" : "textureCube");		break;
			default:
				DE_ASSERT(DE_FALSE);
		}
	}

	str << Token::LEFT_PAREN;
	str << m_sampler->getName();
	str << Token::COMMA;
	m_coordExpr->tokenize(state, str);

	if (m_lodBiasExpr)
	{
		str << Token::COMMA;
		m_lodBiasExpr->tokenize(state, str);
	}

	str << Token::RIGHT_PAREN;
}